

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dump_dtd(void)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  
  uVar2 = 1;
  puVar1 = (uint *)DTDspace;
  while( true ) {
    puVar3 = puVar1 + 9;
    if (uVar2 == 0x4b) break;
    printf("DTD[ %d ] for ",(ulong)uVar2);
    print_atomname(*puVar3 & 0xfffffff);
    putchar(10);
    printf("    dtd_name = %d\n",(ulong)(*puVar3 & 0xfffffff));
    printf("    dtd_size = %d\n",(ulong)(ushort)puVar1[10]);
    printf("    dtd_free = %d\n",(ulong)puVar1[0xb]);
    printf("    dtd_obsolate = %d\n",(ulong)(*puVar3 >> 0x1d & 1));
    printf("    dtd_finalizable = %d\n",(ulong)(*puVar3 >> 0x1c & 1));
    printf("    dtd_lockedp = %d\n",(ulong)(puVar1[0xc] >> 0x1f));
    printf("    dtd_hunkp = %d\n",(ulong)(puVar1[0xc] >> 0x1e & 1));
    printf("    dtd_gctype = %d\n",(ulong)(puVar1[0xc] >> 0x1c & 3));
    printf("    dtd_descrs = %d\n",(ulong)(puVar1[0xc] & 0xfffffff));
    printf("    dtd_typespecs = %d\n",(ulong)puVar1[0xd]);
    printf("    dtd_ptrs = %d\n",(ulong)puVar1[0xe]);
    printf("    dtd_oldcnt = %d\n",(ulong)puVar1[0xf]);
    printf("    dtd_cnt0 = %d\n",(ulong)*(ushort *)((long)puVar1 + 0x2a));
    printf("    dtd_nextpage = %d\n",(ulong)puVar1[0x10]);
    printf("    dtd_typeentry = 0x%x\n",(ulong)*(ushort *)((long)puVar1 + 0x46));
    printf("    dtd_supertype = %d\n",(ulong)(ushort)puVar1[0x11]);
    uVar2 = uVar2 + 1;
    puVar1 = puVar3;
  }
  return;
}

Assistant:

void dump_dtd(void) {
  struct dtd *dtdp;
  DLword cnt;

  dtdp = (struct dtd *)DTDspace;
  dtdp++;

  for (cnt = 0; cnt < INIT_TYPENUM; cnt++) {
    printf("DTD[ %d ] for ", cnt + 1);
#ifdef BIGVM
    print_atomname(dtdp->dtd_name);
#else
    print_atomname(dtdp->dtd_namelo + (dtdp->dtd_namehi << 16));
#endif /* BIGVM */
    putchar('\n');

#ifdef BIGVM
    printf("    dtd_name = %d\n", dtdp->dtd_name);
#else
    printf("    dtd_name = %d\n", dtdp->dtd_namelo + (dtdp->dtd_namehi << 16));
#endif /* BIGVM */
    printf("    dtd_size = %d\n", dtdp->dtd_size);
    printf("    dtd_free = %d\n", dtdp->dtd_free);
    printf("    dtd_obsolate = %d\n", dtdp->dtd_obsolate);
    printf("    dtd_finalizable = %d\n", dtdp->dtd_finalizable);
    printf("    dtd_lockedp = %d\n", dtdp->dtd_lockedp);
    printf("    dtd_hunkp = %d\n", dtdp->dtd_hunkp);
    printf("    dtd_gctype = %d\n", dtdp->dtd_gctype);
    printf("    dtd_descrs = %d\n", dtdp->dtd_descrs);
    printf("    dtd_typespecs = %d\n", dtdp->dtd_typespecs);
    printf("    dtd_ptrs = %d\n", dtdp->dtd_ptrs);
    printf("    dtd_oldcnt = %d\n", dtdp->dtd_oldcnt);
    printf("    dtd_cnt0 = %d\n", dtdp->dtd_cnt0);
    printf("    dtd_nextpage = %d\n", dtdp->dtd_nextpage);
    printf("    dtd_typeentry = 0x%x\n", dtdp->dtd_typeentry);
    printf("    dtd_supertype = %d\n", dtdp->dtd_supertype);

    dtdp++;
  }

}